

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall
QTabWidgetPrivate::initBasicStyleOption(QTabWidgetPrivate *this,QStyleOptionTabWidgetFrame *option)

{
  Representation RVar1;
  bool bVar2;
  undefined4 uVar3;
  QTabWidget *pQVar4;
  QStyle *pQVar5;
  QWidget *this_00;
  QRect *pQVar6;
  QWidget *in_RSI;
  QTabWidgetPrivate *in_RDI;
  QTabWidget *q;
  QWidget *in_stack_ffffffffffffffd8;
  QTabWidgetPrivate *this_01;
  
  this_01 = in_RDI;
  pQVar4 = q_func(in_RDI);
  QStyleOption::initFrom((QStyleOption *)this_01,in_RSI);
  bVar2 = QTabWidget::documentMode((QTabWidget *)in_RDI);
  if (bVar2) {
    *(undefined4 *)&in_RSI[1].field_0x18 = 0;
  }
  else {
    pQVar5 = QWidget::style(in_stack_ffffffffffffffd8);
    uVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,5,0,pQVar4);
    *(undefined4 *)&in_RSI[1].field_0x18 = uVar3;
  }
  switch(in_RDI->pos) {
  case North:
    uVar3 = 4;
    if (in_RDI->shape == Rounded) {
      uVar3 = 0;
    }
    *(undefined4 *)&in_RSI[1].data = uVar3;
    break;
  case South:
    uVar3 = 5;
    if (in_RDI->shape == Rounded) {
      uVar3 = 1;
    }
    *(undefined4 *)&in_RSI[1].data = uVar3;
    break;
  case West:
    uVar3 = 6;
    if (in_RDI->shape == Rounded) {
      uVar3 = 2;
    }
    *(undefined4 *)&in_RSI[1].data = uVar3;
    break;
  case East:
    uVar3 = 7;
    if (in_RDI->shape == Rounded) {
      uVar3 = 3;
    }
    *(undefined4 *)&in_RSI[1].data = uVar3;
  }
  this_00 = &QTabWidget::tabBar((QTabWidget *)in_RDI)->super_QWidget;
  pQVar6 = QWidget::geometry(this_00);
  RVar1.m_i = (pQVar6->y1).m_i;
  *(int *)&in_RSI[2].field_0x14 = (pQVar6->x1).m_i;
  *(int *)&in_RSI[2].field_0x18 = RVar1.m_i;
  *(undefined8 *)&in_RSI[2].field_0x1c = *(undefined8 *)&pQVar6->x2;
  return;
}

Assistant:

void QTabWidgetPrivate::initBasicStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    Q_Q(const QTabWidget);
    option->initFrom(q);

    if (q->documentMode())
        option->lineWidth = 0;
    else
        option->lineWidth = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, nullptr, q);

    switch (pos) {
    case QTabWidget::North:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedNorth
                                                     : QTabBar::TriangularNorth;
        break;
    case QTabWidget::South:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedSouth
                                                     : QTabBar::TriangularSouth;
        break;
    case QTabWidget::West:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedWest
                                                     : QTabBar::TriangularWest;
        break;
    case QTabWidget::East:
        option->shape = shape == QTabWidget::Rounded ? QTabBar::RoundedEast
                                                     : QTabBar::TriangularEast;
        break;
    }

    option->tabBarRect = q->tabBar()->geometry();
}